

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archtraits.cpp
# Opt level: O0

Error asmjit::v1_14::ArchUtils::typeIdToRegSignature
                (Arch arch,TypeId typeId,TypeId *typeIdOut,OperandSignature *regSignatureOut)

{
  byte bVar1;
  Error EVar2;
  TypeId *pTVar3;
  RegType *pRVar4;
  OperandSignature *pOVar5;
  uint32_t *in_RCX;
  TypeId *in_RDX;
  TypeId in_SIL;
  byte in_DIL;
  bool bVar6;
  RegType regType;
  uint32_t size;
  bool is32Bit;
  ArchTraits *archTraits;
  RegType *in_stack_fffffffffffffee8;
  uint6 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  bool local_107;
  TypeId local_105;
  TypeId local_103;
  bool local_102;
  RegType local_f1;
  TypeId local_ca;
  Error local_c8;
  undefined4 local_b0;
  undefined4 local_ac;
  uint local_a8;
  undefined1 local_a3;
  undefined1 local_a2;
  TypeId local_a1;
  undefined4 local_a0;
  undefined4 local_9c;
  uint local_98;
  undefined1 local_93;
  undefined1 local_92;
  TypeId local_91;
  undefined4 local_90;
  undefined4 local_8c;
  uint local_88;
  undefined1 local_83;
  undefined1 local_82;
  TypeId local_81;
  OperandSignature *local_80;
  OperandSignature *local_78;
  OperandSignature *local_70;
  OperandSignature *local_68;
  RegType local_59;
  undefined1 *local_58;
  undefined4 *local_48;
  undefined4 *local_40;
  uint *local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  uint *local_20;
  undefined4 *local_18;
  undefined4 *local_10;
  uint *local_8;
  
  local_ca = in_SIL;
  if (in_SIL < _kBaseStart) {
    pTVar3 = Support::Array<asmjit::v1_14::TypeId,_32UL>::operator[]<asmjit::v1_14::RegType>
                       ((Array<asmjit::v1_14::TypeId,_32UL> *)
                        CONCAT17(in_stack_fffffffffffffef7,
                                 CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
                        in_stack_fffffffffffffee8);
    local_ca = *pTVar3;
  }
  local_91 = local_ca;
  local_92 = 0x20;
  local_93 = 100;
  local_98 = (uint)local_ca;
  local_9c = 0x20;
  local_a0 = 100;
  local_20 = &local_98;
  local_28 = &local_9c;
  local_30 = &local_a0;
  if (local_98 < 0x20 || 100 < local_98) {
    local_c8 = DebugUtils::errored(0x38);
  }
  else {
    local_a1 = local_ca;
    local_a2 = 0x20;
    local_a3 = 0x21;
    local_a8 = (uint)local_ca;
    local_ac = 0x20;
    local_b0 = 0x21;
    local_8 = &local_a8;
    local_10 = &local_ac;
    local_18 = &local_b0;
    local_102 = 0x1f < local_a8 && local_a8 < 0x22;
    if (local_102) {
      bVar6 = (in_DIL & 1) != 1;
      if (local_ca == _kBaseStart) {
        local_103 = kInt32;
        if (bVar6) {
          local_103 = kInt64;
        }
        local_ca = local_103;
      }
      else {
        local_105 = kUInt32;
        if (bVar6) {
          local_105 = _kIntEnd;
        }
        local_ca = local_105;
      }
    }
    bVar1 = TypeUtils::_typeData[(ulong)local_ca + 0x100];
    if (bVar1 == 0) {
      local_c8 = DebugUtils::errored(0x38);
    }
    else if (local_ca == _kBaseEnd) {
      local_c8 = DebugUtils::errored(0x3b);
    }
    else {
      local_81 = local_ca;
      local_82 = 0x20;
      local_83 = 0x33;
      local_88 = (uint)local_ca;
      local_8c = 0x20;
      local_90 = 0x33;
      local_38 = &local_88;
      local_40 = &local_8c;
      local_48 = &local_90;
      local_107 = local_88 < 0x20 || 0x33 < local_88;
      if (local_107) {
        bVar6 = false;
        if (bVar1 < 9) {
          local_68 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                     operator[]<asmjit::v1_14::RegType>
                               ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                CONCAT17(in_stack_fffffffffffffef7,
                                         CONCAT16(in_stack_fffffffffffffef6,
                                                  in_stack_fffffffffffffef0)),
                                in_stack_fffffffffffffee8);
          bVar6 = local_68->_bits != 0;
        }
        if (bVar6) {
          local_f1 = kARM_VecD;
        }
        else {
          in_stack_fffffffffffffef7 = false;
          if (bVar1 < 0x11) {
            local_70 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                       operator[]<asmjit::v1_14::RegType>
                                 ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                  (ulong)CONCAT16(in_stack_fffffffffffffef6,
                                                  in_stack_fffffffffffffef0),
                                  in_stack_fffffffffffffee8);
            in_stack_fffffffffffffef7 = local_70->_bits != 0;
          }
          if ((bool)in_stack_fffffffffffffef7 == false) {
            in_stack_fffffffffffffef6 = false;
            if (bVar1 == 0x20) {
              local_78 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                         operator[]<asmjit::v1_14::RegType>
                                   ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                    (ulong)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
              in_stack_fffffffffffffef6 = local_78->_bits != 0;
            }
            if ((bool)in_stack_fffffffffffffef6 == false) {
              local_80 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
                         operator[]<asmjit::v1_14::RegType>
                                   ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                                    CONCAT17(in_stack_fffffffffffffef7,
                                             (uint7)in_stack_fffffffffffffef0),
                                    in_stack_fffffffffffffee8);
              if (local_80->_bits == 0) {
                EVar2 = DebugUtils::errored(0x38);
                return EVar2;
              }
              local_f1 = kVec512;
            }
            else {
              local_f1 = kVec256;
            }
          }
          else {
            local_f1 = kARM_VecQ;
          }
        }
      }
      else {
        pRVar4 = Support::Array<asmjit::v1_14::RegType,_32UL>::operator[]<unsigned_int>
                           ((Array<asmjit::v1_14::RegType,_32UL> *)
                            CONCAT17(in_stack_fffffffffffffef7,
                                     CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
                            (uint *)in_stack_fffffffffffffee8);
        local_f1 = *pRVar4;
        if (local_f1 == kNone) {
          if ((local_ca != kInt64) && (local_ca != _kIntEnd)) {
            EVar2 = DebugUtils::errored(0x38);
            return EVar2;
          }
          EVar2 = DebugUtils::errored(0x3a);
          return EVar2;
        }
      }
      *in_RDX = local_ca;
      local_59 = local_f1;
      local_58 = _archTraits + (ulong)in_DIL * 0xd8;
      pOVar5 = Support::Array<asmjit::v1_14::OperandSignature,_32UL>::
               operator[]<asmjit::v1_14::RegType>
                         ((Array<asmjit::v1_14::OperandSignature,_32UL> *)
                          CONCAT17(in_stack_fffffffffffffef7,
                                   CONCAT16(in_stack_fffffffffffffef6,in_stack_fffffffffffffef0)),
                          in_stack_fffffffffffffee8);
      *in_RCX = pOVar5->_bits;
      local_c8 = 0;
    }
  }
  return local_c8;
}

Assistant:

ASMJIT_FAVOR_SIZE Error ArchUtils::typeIdToRegSignature(Arch arch, TypeId typeId, TypeId* typeIdOut, OperandSignature* regSignatureOut) noexcept {
  const ArchTraits& archTraits = ArchTraits::byArch(arch);

  // TODO: Remove this, should never be used like this.
  // Passed RegType instead of TypeId?
  if (uint32_t(typeId) <= uint32_t(RegType::kMaxValue))
    typeId = archTraits.regTypeToTypeId(RegType(uint32_t(typeId)));

  if (ASMJIT_UNLIKELY(!TypeUtils::isValid(typeId)))
    return DebugUtils::errored(kErrorInvalidTypeId);

  // First normalize architecture dependent types.
  if (TypeUtils::isAbstract(typeId)) {
    bool is32Bit = Environment::is32Bit(arch);
    if (typeId == TypeId::kIntPtr)
      typeId = is32Bit ? TypeId::kInt32 : TypeId::kInt64;
    else
      typeId = is32Bit ? TypeId::kUInt32 : TypeId::kUInt64;
  }

  // Type size helps to construct all groups of registers.
  // TypeId is invalid if the size is zero.
  uint32_t size = TypeUtils::sizeOf(typeId);
  if (ASMJIT_UNLIKELY(!size))
    return DebugUtils::errored(kErrorInvalidTypeId);

  if (ASMJIT_UNLIKELY(typeId == TypeId::kFloat80))
    return DebugUtils::errored(kErrorInvalidUseOfF80);

  RegType regType = RegType::kNone;
  if (TypeUtils::isBetween(typeId, TypeId::_kBaseStart, TypeId::_kVec32Start)) {
    regType = archTraits._typeIdToRegType[uint32_t(typeId) - uint32_t(TypeId::_kBaseStart)];
    if (regType == RegType::kNone) {
      if (typeId == TypeId::kInt64 || typeId == TypeId::kUInt64)
        return DebugUtils::errored(kErrorInvalidUseOfGpq);
      else
        return DebugUtils::errored(kErrorInvalidTypeId);
    }
  }
  else {
    if (size <= 8 && archTraits._regSignature[RegType::kVec64].isValid())
      regType = RegType::kVec64;
    else if (size <= 16 && archTraits._regSignature[RegType::kVec128].isValid())
      regType = RegType::kVec128;
    else if (size == 32 && archTraits._regSignature[RegType::kVec256].isValid())
      regType = RegType::kVec256;
    else if (archTraits._regSignature[RegType::kVec512].isValid())
      regType = RegType::kVec512;
    else
      return DebugUtils::errored(kErrorInvalidTypeId);
  }

  *typeIdOut = typeId;
  *regSignatureOut = archTraits.regTypeToSignature(regType);
  return kErrorOk;
}